

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

CTSize lj_ctype_vlsize(CTState *cts,CType *ct,CTSize nelem)

{
  CType *pCVar1;
  ulong uVar2;
  ushort uVar3;
  uint uVar4;
  CTInfo CVar5;
  
  CVar5 = ct->info;
  uVar4 = 0;
  pCVar1 = cts->tab;
  if ((CVar5 & 0xf0000000) == 0x10000000) {
    uVar2 = (ulong)ct->size;
    uVar3 = ct->sib;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        if ((pCVar1[uVar3].info & 0xf0000000) == 0x90000000) {
          uVar4 = pCVar1[uVar3].info & 0xffff;
        }
        uVar3 = pCVar1[uVar3].sib;
      } while (uVar3 != 0);
    }
    CVar5 = pCVar1[uVar4].info;
  }
  else {
    uVar2 = 0;
  }
  uVar2 = (ulong)nelem * (ulong)*(uint *)((long)&pCVar1->size + (ulong)((CVar5 & 0xffff) << 4)) +
          uVar2;
  return -(uint)(uVar2 >> 0x1f != 0) | (uint)uVar2;
}

Assistant:

CTSize lj_ctype_vlsize(CTState *cts, CType *ct, CTSize nelem)
{
  uint64_t xsz = 0;
  if (ctype_isstruct(ct->info)) {
    CTypeID arrid = 0, fid = ct->sib;
    xsz = ct->size;  /* Add the struct size. */
    while (fid) {
      CType *ctf = ctype_get(cts, fid);
      if (ctype_type(ctf->info) == CT_FIELD)
	arrid = ctype_cid(ctf->info);  /* Remember last field of VLS. */
      fid = ctf->sib;
    }
    ct = ctype_raw(cts, arrid);
  }
  lua_assert(ctype_isvlarray(ct->info));  /* Must be a VLA. */
  ct = ctype_rawchild(cts, ct);  /* Get array element. */
  lua_assert(ctype_hassize(ct->info));
  /* Calculate actual size of VLA and check for overflow. */
  xsz += (uint64_t)ct->size * nelem;
  return xsz < 0x80000000u ? (CTSize)xsz : CTSIZE_INVALID;
}